

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

int __thiscall Imf_3_2::DeepTiledInputFile::numLevels(DeepTiledInputFile *this)

{
  ostream *poVar1;
  char *pcVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((this->_data->tileDesc).mode != RIPMAP_LEVELS) {
    return this->_data->numXLevels;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Error calling numLevels() on image file \"");
  pcVar2 = fileName(this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (numLevels() is not defined for files with RIPMAP level mode).");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
}

Assistant:

LevelMode
DeepTiledInputFile::levelMode () const
{
    return _data->tileDesc.mode;
}